

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btPolyhedralContactClipping.cpp
# Opt level: O3

bool btPolyhedralContactClipping::findSeparatingAxis
               (btConvexPolyhedron *hullA,btConvexPolyhedron *hullB,btTransform *transA,
               btTransform *transB,btVector3 *sep,Result *resultOut)

{
  undefined8 uVar1;
  undefined8 uVar2;
  ulong uVar3;
  btFace *pbVar4;
  btVector3 *pbVar5;
  undefined1 auVar6 [16];
  btVector3 bVar7;
  bool bVar8;
  int iVar9;
  long lVar10;
  long lVar11;
  int iVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  float fVar20;
  float fVar21;
  btScalar local_1c4;
  btVector3 local_1c0;
  btScalar d;
  float local_1ac;
  int local_1a8;
  int local_1a4;
  long local_1a0;
  btVector3 *local_198;
  int local_18c;
  float local_188;
  float fStack_184;
  float fStack_180;
  float fStack_17c;
  float local_178;
  float fStack_174;
  float fStack_170;
  float fStack_16c;
  btVector3 wA;
  btVector3 wB;
  float local_138 [8];
  btVector3 DeltaC2;
  float local_108;
  undefined8 local_f8;
  float local_e8;
  float fStack_e4;
  float local_d8;
  float local_c8 [38];
  
  gActualSATPairTests = gActualSATPairTests + 1;
  fVar15 = (hullA->m_localCenter).m_floats[0];
  fVar16 = (hullA->m_localCenter).m_floats[1];
  fVar19 = (hullA->m_localCenter).m_floats[2];
  fVar13 = (hullB->m_localCenter).m_floats[0];
  fVar18 = (hullB->m_localCenter).m_floats[1];
  fVar14 = (hullB->m_localCenter).m_floats[2];
  fStack_16c = (transB->m_origin).m_floats[2] +
               (transB->m_basis).m_el[2].m_floats[2] * fVar14 +
               (transB->m_basis).m_el[2].m_floats[0] * fVar13 +
               (transB->m_basis).m_el[2].m_floats[1] * fVar18;
  uVar1 = *(undefined8 *)(transA->m_origin).m_floats;
  uVar2 = *(undefined8 *)(transB->m_origin).m_floats;
  local_188 = ((float)uVar1 +
              (transA->m_basis).m_el[0].m_floats[2] * fVar19 +
              (transA->m_basis).m_el[0].m_floats[0] * fVar15 +
              (transA->m_basis).m_el[0].m_floats[1] * fVar16) -
              ((float)uVar2 +
              (transB->m_basis).m_el[0].m_floats[2] * fVar14 +
              (transB->m_basis).m_el[0].m_floats[0] * fVar13 +
              (transB->m_basis).m_el[0].m_floats[1] * fVar18);
  fStack_184 = ((float)((ulong)uVar1 >> 0x20) +
               (transA->m_basis).m_el[1].m_floats[2] * fVar19 +
               (transA->m_basis).m_el[1].m_floats[0] * fVar15 +
               (transA->m_basis).m_el[1].m_floats[1] * fVar16) -
               ((float)((ulong)uVar2 >> 0x20) +
               (transB->m_basis).m_el[1].m_floats[2] * fVar14 +
               (transB->m_basis).m_el[1].m_floats[0] * fVar13 +
               (transB->m_basis).m_el[1].m_floats[1] * fVar18);
  fStack_180 = ((transA->m_basis).m_el[1].m_floats[0] * fVar19 +
                (transA->m_basis).m_el[0].m_floats[2] * fVar15 +
                (transA->m_basis).m_el[0].m_floats[3] * fVar16 + 0.0) -
               ((transB->m_basis).m_el[1].m_floats[0] * fVar14 +
                (transB->m_basis).m_el[0].m_floats[2] * fVar13 +
                (transB->m_basis).m_el[0].m_floats[3] * fVar18 + 0.0);
  fStack_17c = ((transA->m_basis).m_el[1].m_floats[1] * fVar19 +
                (transA->m_basis).m_el[0].m_floats[3] * fVar15 +
                (transA->m_basis).m_el[1].m_floats[0] * fVar16 + 0.0) -
               ((transB->m_basis).m_el[1].m_floats[1] * fVar14 +
                (transB->m_basis).m_el[0].m_floats[3] * fVar13 +
                (transB->m_basis).m_el[1].m_floats[0] * fVar18 + 0.0);
  local_178 = ((transA->m_origin).m_floats[2] +
              (transA->m_basis).m_el[2].m_floats[2] * fVar19 +
              (transA->m_basis).m_el[2].m_floats[0] * fVar15 +
              (transA->m_basis).m_el[2].m_floats[1] * fVar16) - fStack_16c;
  fStack_174 = fStack_16c - fStack_16c;
  fStack_170 = ((transA->m_origin).m_floats[0] * (hullA->m_extents).m_floats[0] +
                (transA->m_basis).m_el[2].m_floats[2] * (hullA->m_localCenter).m_floats[2] +
                (transA->m_basis).m_el[2].m_floats[3] * (hullA->m_localCenter).m_floats[3] + 0.0) -
               fStack_16c;
  fStack_16c = ((transA->m_origin).m_floats[1] * (hullA->m_extents).m_floats[1] +
                (transA->m_basis).m_el[2].m_floats[3] * (hullA->m_localCenter).m_floats[3] +
                (transA->m_origin).m_floats[0] * (hullA->m_extents).m_floats[0] + 0.0) - fStack_16c;
  DeltaC2.m_floats[1] = fStack_184;
  DeltaC2.m_floats[0] = local_188;
  DeltaC2.m_floats[2] = local_178;
  DeltaC2.m_floats[3] = 0.0;
  lVar10 = (long)(hullA->m_faces).m_size;
  local_198 = sep;
  if (lVar10 < 1) {
    local_1c4 = 3.4028235e+38;
  }
  else {
    local_1c4 = 3.4028235e+38;
    lVar11 = 0;
    do {
      pbVar4 = (hullA->m_faces).m_data;
      fVar13 = *(float *)((long)pbVar4->m_plane + lVar11);
      fVar18 = *(float *)((long)pbVar4->m_plane + lVar11 + 4);
      fVar14 = *(float *)((long)pbVar4->m_plane + lVar11 + 8);
      fVar15 = fVar14 * (transA->m_basis).m_el[0].m_floats[2] +
               fVar13 * (transA->m_basis).m_el[0].m_floats[0] +
               (transA->m_basis).m_el[0].m_floats[1] * fVar18;
      fVar16 = fVar14 * (transA->m_basis).m_el[1].m_floats[2] +
               fVar13 * (transA->m_basis).m_el[1].m_floats[0] +
               (transA->m_basis).m_el[1].m_floats[1] * fVar18;
      fVar13 = fVar14 * (transA->m_basis).m_el[2].m_floats[2] +
               fVar13 * (transA->m_basis).m_el[2].m_floats[0] +
               fVar18 * (transA->m_basis).m_el[2].m_floats[1];
      local_1c0.m_floats[1] = fVar16;
      local_1c0.m_floats[0] = fVar15;
      local_1c0.m_floats[2] = fVar13;
      if (local_178 * fVar13 + local_188 * fVar15 + fStack_184 * fVar16 < 0.0) {
        local_1c0.m_floats[2] = -fVar13;
        local_1c0.m_floats._0_8_ = CONCAT44(fVar16,fVar15) ^ 0x8000000080000000;
      }
      local_1c0.m_floats[3] = 0.0;
      local_1c0.m_floats[0] = (btScalar)local_1c0.m_floats[0];
      local_1c0.m_floats[1] = (btScalar)local_1c0.m_floats[1];
      local_1c0.m_floats[2] = (btScalar)local_1c0.m_floats[2];
      gExpectedNbTests = gExpectedNbTests + 1;
      if ((gUseInternalObject != true) ||
         (bVar8 = TestInternalObjects(transA,transB,&DeltaC2,&local_1c0,hullA,hullB,local_1c4),
         bVar8)) {
        gActualNbTests = gActualNbTests + 1;
        bVar8 = TestSepAxis(hullA,hullB,transA,transB,&local_1c0,&d,&wA,&wB);
        if (!bVar8) {
          return false;
        }
        if (d < local_1c4) {
          *(undefined8 *)local_198->m_floats = local_1c0.m_floats._0_8_;
          *(undefined8 *)(local_198->m_floats + 2) = local_1c0.m_floats._8_8_;
          local_1c4 = d;
        }
      }
      lVar11 = lVar11 + 0x30;
    } while (lVar10 * 0x30 != lVar11);
  }
  lVar10 = (long)(hullB->m_faces).m_size;
  if (0 < lVar10) {
    lVar11 = 0;
    do {
      pbVar4 = (hullB->m_faces).m_data;
      fVar13 = *(float *)((long)pbVar4->m_plane + lVar11);
      fVar18 = *(float *)((long)pbVar4->m_plane + lVar11 + 4);
      fVar14 = *(float *)((long)pbVar4->m_plane + lVar11 + 8);
      fVar15 = fVar14 * (transB->m_basis).m_el[0].m_floats[2] +
               fVar13 * (transB->m_basis).m_el[0].m_floats[0] +
               (transB->m_basis).m_el[0].m_floats[1] * fVar18;
      fVar16 = fVar14 * (transB->m_basis).m_el[1].m_floats[2] +
               fVar13 * (transB->m_basis).m_el[1].m_floats[0] +
               (transB->m_basis).m_el[1].m_floats[1] * fVar18;
      fVar13 = fVar14 * (transB->m_basis).m_el[2].m_floats[2] +
               fVar13 * (transB->m_basis).m_el[2].m_floats[0] +
               fVar18 * (transB->m_basis).m_el[2].m_floats[1];
      local_1c0.m_floats[1] = fVar16;
      local_1c0.m_floats[0] = fVar15;
      local_1c0.m_floats[2] = fVar13;
      if (local_178 * fVar13 + local_188 * fVar15 + fStack_184 * fVar16 < 0.0) {
        local_1c0.m_floats[2] = -fVar13;
        local_1c0.m_floats._0_8_ = CONCAT44(fVar16,fVar15) ^ 0x8000000080000000;
      }
      local_1c0.m_floats[3] = 0.0;
      local_1c0.m_floats[0] = (btScalar)local_1c0.m_floats[0];
      local_1c0.m_floats[1] = (btScalar)local_1c0.m_floats[1];
      local_1c0.m_floats[2] = (btScalar)local_1c0.m_floats[2];
      gExpectedNbTests = gExpectedNbTests + 1;
      if ((gUseInternalObject != true) ||
         (bVar8 = TestInternalObjects(transA,transB,&DeltaC2,&local_1c0,hullA,hullB,local_1c4),
         bVar8)) {
        gActualNbTests = gActualNbTests + 1;
        bVar8 = TestSepAxis(hullA,hullB,transA,transB,&local_1c0,&d,&wA,&wB);
        if (!bVar8) {
          return false;
        }
        if (d < local_1c4) {
          *(undefined8 *)local_198->m_floats = local_1c0.m_floats._0_8_;
          *(undefined8 *)(local_198->m_floats + 2) = local_1c0.m_floats._8_8_;
          local_1c4 = d;
        }
      }
      lVar11 = lVar11 + 0x30;
    } while (lVar10 * 0x30 != lVar11);
  }
  iVar9 = (hullA->m_uniqueEdges).m_size;
  if (0 < iVar9) {
    iVar12 = (hullB->m_uniqueEdges).m_size;
    local_1a4 = -1;
    local_1a0 = 0;
    local_1a8 = -1;
    local_1ac = 0.0;
    fVar13 = 0.0;
    local_138[0] = 0.0;
    local_138[1] = 0.0;
    local_c8[0] = 0.0;
    local_c8[1] = 0.0;
    do {
      if (0 < iVar12) {
        pbVar5 = (hullA->m_uniqueEdges).m_data;
        fVar18 = pbVar5[local_1a0].m_floats[0];
        fVar14 = pbVar5[local_1a0].m_floats[1];
        fVar15 = pbVar5[local_1a0].m_floats[2];
        fVar19 = (transA->m_basis).m_el[0].m_floats[2] * fVar15 +
                 (transA->m_basis).m_el[0].m_floats[0] * fVar18 +
                 (transA->m_basis).m_el[0].m_floats[1] * fVar14;
        fVar16 = fVar15 * (transA->m_basis).m_el[1].m_floats[2] +
                 fVar18 * (transA->m_basis).m_el[1].m_floats[0] +
                 (transA->m_basis).m_el[1].m_floats[1] * fVar14;
        fVar18 = fVar15 * (transA->m_basis).m_el[2].m_floats[2] +
                 fVar18 * (transA->m_basis).m_el[2].m_floats[0] +
                 (transA->m_basis).m_el[2].m_floats[1] * fVar14;
        lVar10 = 8;
        lVar11 = 0;
        do {
          pbVar5 = (hullB->m_uniqueEdges).m_data;
          fVar14 = *(float *)((long)pbVar5->m_floats + lVar10 + -8);
          fVar15 = *(float *)((long)pbVar5->m_floats + lVar10 + -4);
          fVar17 = *(float *)((long)pbVar5->m_floats + lVar10);
          fVar21 = (transB->m_basis).m_el[1].m_floats[2] * fVar17 +
                   (transB->m_basis).m_el[1].m_floats[0] * fVar14 +
                   (transB->m_basis).m_el[1].m_floats[1] * fVar15;
          fVar20 = fVar17 * (transB->m_basis).m_el[2].m_floats[2] +
                   fVar14 * (transB->m_basis).m_el[2].m_floats[0] +
                   (transB->m_basis).m_el[2].m_floats[1] * fVar15;
          fVar15 = fVar17 * (transB->m_basis).m_el[0].m_floats[2] +
                   fVar14 * (transB->m_basis).m_el[0].m_floats[0] +
                   (transB->m_basis).m_el[0].m_floats[1] * fVar15;
          local_1c0.m_floats[0] = fVar16 * fVar20 + fVar21 * -fVar18;
          fVar14 = fVar18 * fVar15 + fVar20 * -fVar19;
          local_1c0.m_floats[2] = fVar19 * fVar21 + fVar15 * -fVar16;
          if (((1e-06 < ABS(local_1c0.m_floats[0])) || (1e-06 < ABS(fVar14))) ||
             (1e-06 < ABS(local_1c0.m_floats[2]))) {
            local_1c0.m_floats[1] =
                 1.0 / SQRT(local_1c0.m_floats[2] * local_1c0.m_floats[2] +
                            local_1c0.m_floats[0] * local_1c0.m_floats[0] + fVar14 * fVar14);
            local_1c0.m_floats[2] = local_1c0.m_floats[2] * local_1c0.m_floats[1];
            local_1c0.m_floats[0] = local_1c0.m_floats[1] * local_1c0.m_floats[0];
            local_1c0.m_floats[1] = local_1c0.m_floats[1] * fVar14;
            if (local_178 * local_1c0.m_floats[2] +
                local_188 * local_1c0.m_floats[0] + fStack_184 * local_1c0.m_floats[1] < 0.0) {
              local_1c0.m_floats[2] = -local_1c0.m_floats[2];
              local_1c0.m_floats._0_8_ =
                   CONCAT44(local_1c0.m_floats[1],local_1c0.m_floats[0]) ^ 0x8000000080000000;
            }
            local_1c0.m_floats[3] = 0.0;
            local_1c0.m_floats[0] = (btScalar)local_1c0.m_floats[0];
            local_1c0.m_floats[1] = (btScalar)local_1c0.m_floats[1];
            local_1c0.m_floats[2] = (btScalar)local_1c0.m_floats[2];
            gExpectedNbTests = gExpectedNbTests + 1;
            if ((gUseInternalObject != true) ||
               (local_18c = iVar12,
               bVar8 = TestInternalObjects(transA,transB,&DeltaC2,&local_1c0,hullA,hullB,local_1c4),
               iVar12 = local_18c, bVar8)) {
              gActualNbTests = gActualNbTests + 1;
              bVar8 = TestSepAxis(hullA,hullB,transA,transB,&local_1c0,&d,&wA,&wB);
              bVar7 = wA;
              if (!bVar8) {
                return false;
              }
              if (d < local_1c4) {
                *(undefined8 *)local_198->m_floats = local_1c0.m_floats._0_8_;
                *(undefined8 *)(local_198->m_floats + 2) = local_1c0.m_floats._8_8_;
                local_c8[0] = wA.m_floats[0];
                local_c8[1] = wA.m_floats[1];
                wA.m_floats[2] = bVar7.m_floats[2];
                local_1ac = wA.m_floats[2];
                local_138[0] = wB.m_floats[0];
                local_138[1] = wB.m_floats[1];
                local_f8 = CONCAT44(fVar16,fVar19);
                local_1a8 = (int)lVar11;
                local_1a4 = (int)local_1a0;
                local_1c4 = d;
                local_e8 = fVar15;
                fStack_e4 = fVar21;
                local_d8 = fVar20;
                fVar13 = wB.m_floats[2];
                local_108 = fVar18;
              }
              iVar12 = (hullB->m_uniqueEdges).m_size;
              wA = bVar7;
            }
          }
          lVar11 = lVar11 + 1;
          lVar10 = lVar10 + 0x10;
        } while (lVar11 < iVar12);
        iVar9 = (hullA->m_uniqueEdges).m_size;
      }
      local_1a0 = local_1a0 + 1;
    } while (local_1a0 < iVar9);
    if ((-1 < local_1a4) && (-1 < local_1a8)) {
      local_c8[0] = local_138[0] - local_c8[0];
      local_c8[1] = local_138[1] - local_c8[1];
      fVar15 = fVar13 - local_1ac;
      fVar18 = local_108 * local_d8 + (float)local_f8 * local_e8 + local_f8._4_4_ * fStack_e4;
      fVar14 = local_108 * fVar15 + (float)local_f8 * local_c8[0] + local_f8._4_4_ * local_c8[1];
      fVar16 = 1.0 - fVar18 * fVar18;
      fVar19 = -(local_d8 * fVar15 + local_e8 * local_c8[0] + fStack_e4 * local_c8[1]);
      if ((fVar16 != 0.0) || (fVar17 = 0.0, NAN(fVar16))) {
        fVar16 = (fVar19 * fVar18 + fVar14) / fVar16;
        fVar17 = -1e+30;
        if ((-1e+30 <= fVar16) && (fVar17 = fVar16, 1e+30 < fVar16)) {
          fVar17 = 1e+30;
        }
      }
      fVar19 = fVar17 * fVar18 + fVar19;
      if (-1e+30 <= fVar19) {
        if (1e+30 < fVar19) {
          fVar19 = 1e+30;
          fVar14 = fVar18 * 1e+30 + fVar14;
          fVar17 = -1e+30;
          if ((-1e+30 <= fVar14) && (fVar19 = 1e+30, fVar17 = fVar14, 1e+30 < fVar14)) {
            fVar19 = 1e+30;
            fVar17 = fVar19;
          }
        }
      }
      else {
        fVar19 = -1e+30;
        fVar14 = fVar18 * -1e+30 + fVar14;
        fVar17 = fVar19;
        if ((-1e+30 <= fVar14) && (fVar17 = fVar14, 1e+30 < fVar14)) {
          fVar17 = 1e+30;
        }
      }
      local_1c0.m_floats[0] = (local_c8[0] - (float)local_f8 * fVar17) + local_e8 * fVar19;
      local_1c0.m_floats[1] = (local_c8[1] - local_f8._4_4_ * fVar17) + fStack_e4 * fVar19;
      fVar14 = (fVar15 - local_108 * fVar17) + local_d8 * fVar19;
      fVar18 = fVar14 * fVar14 +
               local_1c0.m_floats[0] * local_1c0.m_floats[0] +
               local_1c0.m_floats[1] * local_1c0.m_floats[1];
      if (1.1920929e-07 < fVar18) {
        fVar18 = SQRT(fVar18);
        local_1c0.m_floats[2] = 1.0 / fVar18;
        local_1c0.m_floats[0] = local_1c0.m_floats[2] * local_1c0.m_floats[0];
        local_1c0.m_floats[1] = local_1c0.m_floats[2] * local_1c0.m_floats[1];
        local_1c0.m_floats[2] = local_1c0.m_floats[2] * fVar14;
        if (local_1c0.m_floats[2] * local_178 +
            local_1c0.m_floats[0] * local_188 + local_1c0.m_floats[1] * fStack_184 < 0.0) {
          local_1c0.m_floats[2] = -local_1c0.m_floats[2];
          local_1c0.m_floats._0_8_ =
               CONCAT44(local_1c0.m_floats[1],local_1c0.m_floats[0]) ^ 0x8000000080000000;
        }
        local_1c0.m_floats[3] = 0.0;
        local_1c0.m_floats[0] = (btScalar)local_1c0.m_floats[0];
        local_1c0.m_floats[1] = (btScalar)local_1c0.m_floats[1];
        local_1c0.m_floats[2] = (btScalar)local_1c0.m_floats[2];
        wA.m_floats[1] = local_138[1] + fStack_e4 * fVar19;
        wA.m_floats[0] = local_138[0] + local_e8 * fVar19;
        wA.m_floats[2] = fVar13 + local_d8 * fVar19;
        wA.m_floats[3] = 0.0;
        (*resultOut->_vptr_Result[4])(-fVar18,resultOut,&local_1c0);
      }
    }
  }
  uVar3 = *(ulong *)local_198->m_floats;
  if (local_178 * local_198->m_floats[2] +
      local_188 * (float)uVar3 + fStack_184 * (float)(uVar3 >> 0x20) < 0.0) {
    auVar6._8_4_ = -local_198->m_floats[2];
    auVar6._0_8_ = uVar3 ^ 0x8000000080000000;
    auVar6._12_4_ = 0;
    *(undefined1 (*) [16])local_198->m_floats = auVar6;
  }
  return true;
}

Assistant:

bool btPolyhedralContactClipping::findSeparatingAxis(	const btConvexPolyhedron& hullA, const btConvexPolyhedron& hullB, const btTransform& transA,const btTransform& transB, btVector3& sep, btDiscreteCollisionDetectorInterface::Result& resultOut)
{
	gActualSATPairTests++;

//#ifdef TEST_INTERNAL_OBJECTS
	const btVector3 c0 = transA * hullA.m_localCenter;
	const btVector3 c1 = transB * hullB.m_localCenter;
	const btVector3 DeltaC2 = c0 - c1;
//#endif

	btScalar dmin = FLT_MAX;
	int curPlaneTests=0;

	int numFacesA = hullA.m_faces.size();
	// Test normals from hullA
	for(int i=0;i<numFacesA;i++)
	{
		const btVector3 Normal(hullA.m_faces[i].m_plane[0], hullA.m_faces[i].m_plane[1], hullA.m_faces[i].m_plane[2]);
		btVector3 faceANormalWS = transA.getBasis() * Normal;
		if (DeltaC2.dot(faceANormalWS)<0)
			faceANormalWS*=-1.f;

		curPlaneTests++;
#ifdef TEST_INTERNAL_OBJECTS
		gExpectedNbTests++;
		if(gUseInternalObject && !TestInternalObjects(transA,transB, DeltaC2, faceANormalWS, hullA, hullB, dmin))
			continue;
		gActualNbTests++;
#endif

		btScalar d;
		btVector3 wA,wB;
		if(!TestSepAxis( hullA, hullB, transA,transB, faceANormalWS, d,wA,wB))
			return false;

		if(d<dmin)
		{
			dmin = d;
			sep = faceANormalWS;
		}
	}

	int numFacesB = hullB.m_faces.size();
	// Test normals from hullB
	for(int i=0;i<numFacesB;i++)
	{
		const btVector3 Normal(hullB.m_faces[i].m_plane[0], hullB.m_faces[i].m_plane[1], hullB.m_faces[i].m_plane[2]);
		btVector3 WorldNormal = transB.getBasis() * Normal;
		if (DeltaC2.dot(WorldNormal)<0)
			WorldNormal *=-1.f;

		curPlaneTests++;
#ifdef TEST_INTERNAL_OBJECTS
		gExpectedNbTests++;
		if(gUseInternalObject && !TestInternalObjects(transA,transB,DeltaC2, WorldNormal, hullA, hullB, dmin))
			continue;
		gActualNbTests++;
#endif

		btScalar d;
		btVector3 wA,wB;
		if(!TestSepAxis(hullA, hullB,transA,transB, WorldNormal,d,wA,wB))
			return false;

		if(d<dmin)
		{
			dmin = d;
			sep = WorldNormal;
		}
	}

	btVector3 edgeAstart,edgeAend,edgeBstart,edgeBend;
	int edgeA=-1;
	int edgeB=-1;
	btVector3 worldEdgeA;
	btVector3 worldEdgeB;
	btVector3 witnessPointA(0,0,0),witnessPointB(0,0,0);
	

	int curEdgeEdge = 0;
	// Test edges
	for(int e0=0;e0<hullA.m_uniqueEdges.size();e0++)
	{
		const btVector3 edge0 = hullA.m_uniqueEdges[e0];
		const btVector3 WorldEdge0 = transA.getBasis() * edge0;
		for(int e1=0;e1<hullB.m_uniqueEdges.size();e1++)
		{
			const btVector3 edge1 = hullB.m_uniqueEdges[e1];
			const btVector3 WorldEdge1 = transB.getBasis() * edge1;

			btVector3 Cross = WorldEdge0.cross(WorldEdge1);
			curEdgeEdge++;
			if(!IsAlmostZero(Cross))
			{
				Cross = Cross.normalize();
				if (DeltaC2.dot(Cross)<0)
					Cross *= -1.f;


#ifdef TEST_INTERNAL_OBJECTS
				gExpectedNbTests++;
				if(gUseInternalObject && !TestInternalObjects(transA,transB,DeltaC2, Cross, hullA, hullB, dmin))
					continue;
				gActualNbTests++;
#endif

				btScalar dist;
				btVector3 wA,wB;
				if(!TestSepAxis( hullA, hullB, transA,transB, Cross, dist,wA,wB))
					return false;

				if(dist<dmin)
				{
					dmin = dist;
					sep = Cross;
					edgeA=e0;
					edgeB=e1;
					worldEdgeA = WorldEdge0;
					worldEdgeB = WorldEdge1;
					witnessPointA=wA;
					witnessPointB=wB;
				}
			}
		}

	}

	if (edgeA>=0&&edgeB>=0)
	{
//		printf("edge-edge\n");
		//add an edge-edge contact

		btVector3 ptsVector;
		btVector3 offsetA;
		btVector3 offsetB;
		btScalar tA;
		btScalar tB;

		btVector3 translation = witnessPointB-witnessPointA;

		btVector3 dirA = worldEdgeA;
		btVector3 dirB = worldEdgeB;
		
		btScalar hlenB = 1e30f;
		btScalar hlenA = 1e30f;

		btSegmentsClosestPoints(ptsVector,offsetA,offsetB,tA,tB,
			translation,
			dirA, hlenA,
			dirB,hlenB);

		btScalar nlSqrt = ptsVector.length2();
		if (nlSqrt>SIMD_EPSILON)
		{
			btScalar nl = btSqrt(nlSqrt);
			ptsVector *= 1.f/nl;
			if (ptsVector.dot(DeltaC2)<0.f)
			{
				ptsVector*=-1.f;
			}
			btVector3 ptOnB = witnessPointB + offsetB;
			btScalar distance = nl;
			resultOut.addContactPoint(ptsVector, ptOnB,-distance);
		}

	}


	if((DeltaC2.dot(sep))<0.0f)
		sep = -sep;

	return true;
}